

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O0

int amrex::EB2::anon_unknown_45::comp_max_crse_level(Box cdomain,Box *domain)

{
  bool bVar1;
  Box *in_RDI;
  int ilev;
  Box *this;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  this = (Box *)&stack0x00000008;
  iVar2 = 0;
  while ((iVar2 < 0x1e && (bVar1 = Box::contains(this,in_RDI), !bVar1))) {
    Box::refine(domain,ilev);
    iVar2 = iVar2 + 1;
  }
  bVar1 = Box::operator!=((Box *)CONCAT44(iVar2,in_stack_fffffffffffffff0),this);
  if (bVar1) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int comp_max_crse_level (Box cdomain, const Box& domain)
{
    int ilev;
    for (ilev = 0; ilev < 30; ++ilev) {
        if (cdomain.contains(domain)) break;
        cdomain.refine(2);
    }
    if (cdomain != domain) ilev = -1;
    return ilev;
}